

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_basetableref.cpp
# Opt level: O2

unique_ptr<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>,_true> __thiscall
duckdb::Binder::BindAtClause(Binder *this,optional_ptr<duckdb::AtClause,_true> at_clause)

{
  ClientContext *pCVar1;
  AtClause *pAVar2;
  type expr;
  long in_RDX;
  undefined1 local_110 [8];
  optional_ptr<duckdb::AtClause,_true> at_clause_local;
  string local_100;
  Value val;
  ConstantBinder binder;
  
  if (in_RDX == 0) {
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  else {
    pCVar1 = (ClientContext *)((at_clause.ptr)->unit).field_2._M_allocated_capacity;
    ::std::__cxx11::string::string((string *)&local_100,"AT clause",(allocator *)&val);
    ConstantBinder::ConstantBinder(&binder,(Binder *)at_clause.ptr,pCVar1,&local_100);
    ::std::__cxx11::string::~string((string *)&local_100);
    pAVar2 = optional_ptr<duckdb::AtClause,_true>::operator->(&at_clause_local);
    ExpressionBinder::Bind
              ((ExpressionBinder *)local_110,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&binder,(optional_ptr<duckdb::LogicalType,_true>)&pAVar2->expr,false);
    pCVar1 = (ClientContext *)((at_clause.ptr)->unit).field_2._M_allocated_capacity;
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)local_110);
    ExpressionExecutor::EvaluateScalar(&val,pCVar1,expr,false);
    pAVar2 = optional_ptr<duckdb::AtClause,_true>::operator->(&at_clause_local);
    make_uniq<duckdb::BoundAtClause,std::__cxx11::string_const&,duckdb::Value>
              ((duckdb *)this,&pAVar2->unit,&val);
    Value::~Value(&val);
    if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)local_110
        != (Expression *)0x0) {
      (**(code **)(*(_func_int **)local_110 + 8))();
    }
    ConstantBinder::~ConstantBinder(&binder);
  }
  return (unique_ptr<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>_>)
         (unique_ptr<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>_>)this;
}

Assistant:

unique_ptr<BoundAtClause> Binder::BindAtClause(optional_ptr<AtClause> at_clause) {
	if (!at_clause) {
		return nullptr;
	}
	ConstantBinder binder(*this, context, "AT clause");
	auto expr = binder.Bind(at_clause->ExpressionMutable());
	auto val = ExpressionExecutor::EvaluateScalar(context, *expr);
	return make_uniq<BoundAtClause>(at_clause->Unit(), std::move(val));
}